

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto3.upb.h
# Opt level: O2

bool protobuf_test_messages_proto3_TestAllTypesProto3_map_string_string_next
               (protobuf_test_messages_proto3_TestAllTypesProto3 *msg,upb_StringView *key,
               upb_StringView *val,size_t *iter)

{
  _Bool _Var1;
  upb_Map *map;
  upb_MessageValue v;
  upb_MessageValue k;
  upb_MiniTableField field;
  upb_MessageValue local_48;
  upb_MessageValue local_38;
  upb_MiniTableField local_28;
  
  local_28.number_dont_copy_me__upb_internal_use_only = 0x45;
  local_28.offset_dont_copy_me__upb_internal_use_only = 0x228;
  local_28.presence = 0;
  local_28.submsg_index_dont_copy_me__upb_internal_use_only = 0x12;
  local_28.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  local_28.mode_dont_copy_me__upb_internal_use_only = 0xc0;
  map = upb_Message_GetMap(&msg->base_dont_copy_me__upb_internal_use_only,&local_28);
  if (map == (upb_Map *)0x0) {
    _Var1 = false;
  }
  else {
    _Var1 = upb_Map_Next(map,&local_38,&local_48,iter);
    if (_Var1) {
      key->data = (char *)local_38.double_val;
      key->size = local_38.str_val.size;
      val->data = (char *)local_48.double_val;
      val->size = local_48.str_val.size;
    }
  }
  return _Var1;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto3_TestAllTypesProto3_map_string_string_next(const protobuf_test_messages_proto3_TestAllTypesProto3* msg, upb_StringView* key, upb_StringView* val,
                           size_t* iter) {
  const upb_MiniTableField field = {69, UPB_SIZE(196, 552), 0, 18, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto3__TestAllTypesProto3__MapStringStringEntry_msg_init);
  const upb_Map* map = upb_Message_GetMap(UPB_UPCAST(msg), &field);
  if (!map) return false;
  upb_MessageValue k;
  upb_MessageValue v;
  if (!upb_Map_Next(map, &k, &v, iter)) return false;
  memcpy(key, &k, sizeof(*key));
  memcpy(val, &v, sizeof(*val));
  return true;
}